

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O0

int stlstp_(double *y,int *n,int *np,int *ns,int *nt,int *nl,int *isdeg,int *itdeg,int *ildeg,
           int *nsjump,int *ntjump,int *nljump,int *ni,int *userw,double *rw,double *season,
           double *trend,double *work)

{
  int iVar1;
  int iVar2;
  int local_74;
  int local_70;
  int c_false;
  int j;
  int i__;
  int i__2;
  int i__1;
  int work_offset;
  int work_dim1;
  int *nl_local;
  int *nt_local;
  int *ns_local;
  int *np_local;
  int *n_local;
  double *y_local;
  
  local_74 = 0;
  n_local = (int *)(y + -1);
  i__1 = *n + *np * 2;
  iVar2 = i__1 + 1;
  i__ = *ni;
  i__2 = iVar2;
  _work_offset = nl;
  nl_local = nt;
  nt_local = ns;
  ns_local = np;
  np_local = n;
  for (local_70 = 1; local_70 <= i__; local_70 = local_70 + 1) {
    j = *np_local;
    for (c_false = 1; c_false <= j; c_false = c_false + 1) {
      work[(long)(c_false + i__1) - (long)iVar2] =
           *(double *)(n_local + (long)c_false * 2) - trend[(long)c_false + -1];
    }
    stlss_(work + ((long)(i__1 + 1) - (long)iVar2),np_local,ns_local,nt_local,isdeg,nsjump,userw,rw,
           work + ((long)(i__1 * 2 + 1) - (long)iVar2),work + ((long)(i__1 * 3 + 1) - (long)iVar2),
           work + ((long)(i__1 * 4 + 1) - (long)iVar2),work + ((long)(i__1 * 5 + 1) - (long)iVar2),
           season);
    j = *np_local + *ns_local * 2;
    stlfts_(work + ((long)(i__1 * 2 + 1) - (long)iVar2),&j,ns_local,
            work + ((long)(i__1 * 3 + 1) - (long)iVar2),work + ((long)(i__1 + 1) - (long)iVar2));
    stless_(work + ((long)(i__1 * 3 + 1) - (long)iVar2),np_local,_work_offset,ildeg,nljump,&local_74
            ,work + ((long)(i__1 * 4 + 1) - (long)iVar2),work + ((long)(i__1 + 1) - (long)iVar2),
            work + ((long)(i__1 * 5 + 1) - (long)iVar2));
    iVar1 = *np_local;
    for (c_false = 1; c_false <= iVar1; c_false = c_false + 1) {
      season[(long)c_false + -1] =
           work[(long)(*ns_local + c_false + i__1 * 2) - (long)iVar2] -
           work[(long)(c_false + i__1) - (long)iVar2];
    }
    j = *np_local;
    for (c_false = 1; c_false <= j; c_false = c_false + 1) {
      work[(long)(c_false + i__1) - (long)iVar2] =
           *(double *)(n_local + (long)c_false * 2) - season[(long)c_false + -1];
    }
    stless_(work + ((long)(i__1 + 1) - (long)iVar2),np_local,nl_local,itdeg,ntjump,userw,rw,trend,
            work + ((long)(i__1 * 3 + 1) - (long)iVar2));
  }
  return 0;
}

Assistant:

int stlstp_(double *y, int *n, int *np, int *ns, int *nt, int *nl, int *isdeg, int *itdeg, int 
	*ildeg, int *nsjump, int *ntjump, int *nljump, int *ni, int *userw, double *rw, double *season,
	double *trend, double *work)
{
    /* System generated locals */
    int work_dim1, work_offset, i__1, i__2;

    /* Local variables */
    int i__, j;
	int c_false = 0;

/* Arg */
/* Var */
    /* Parameter adjustments */
    --trend;
    --season;
    --rw;
    --y;
    work_dim1 = *n + 2 * *np;
    work_offset = 1 + work_dim1;
    work -= work_offset;

    /* Function Body */
    i__1 = *ni;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    work[i__ + work_dim1] = y[i__] - trend[i__];
/* L1: */
	}
	stlss_(&work[work_dim1 + 1], n, np, ns, isdeg, nsjump, userw, &rw[1], 
		&work[(work_dim1 << 1) + 1], &work[work_dim1 * 3 + 1], &work[(
		work_dim1 << 2) + 1], &work[work_dim1 * 5 + 1], &season[1]);
	i__2 = *n + (*np << 1);
	stlfts_(&work[(work_dim1 << 1) + 1], &i__2, np, &work[work_dim1 * 3 + 
		1], &work[work_dim1 + 1]);
	stless_(&work[work_dim1 * 3 + 1], n, nl, ildeg, nljump, &c_false, &
		work[(work_dim1 << 2) + 1], &work[work_dim1 + 1], &work[
		work_dim1 * 5 + 1]);
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    season[i__] = work[*np + i__ + (work_dim1 << 1)] - work[i__ + 
		    work_dim1];
/* L3: */
	}
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    work[i__ + work_dim1] = y[i__] - season[i__];
/* L5: */
	}
	stless_(&work[work_dim1 + 1], n, nt, itdeg, ntjump, userw, &rw[1], &
		trend[1], &work[work_dim1 * 3 + 1]);
/* L80: */
    }
    return 0;
}